

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O0

size_t flow::computeStackSize(Instruction *program,size_t programSize)

{
  int iVar1;
  unsigned_long *puVar2;
  unsigned_long uStack_38;
  int change;
  size_t limit;
  size_t stackSize;
  Instruction *e;
  Instruction *i;
  size_t programSize_local;
  Instruction *program_local;
  
  stackSize = (size_t)(program + programSize);
  limit = 0;
  uStack_38 = 0;
  i = (Instruction *)programSize;
  programSize_local = (size_t)program;
  for (e = program; e != (Instruction *)stackSize; e = e + 1) {
    iVar1 = getStackChange(*e);
    limit = (long)iVar1 + limit;
    puVar2 = std::max<unsigned_long>(&stack0xffffffffffffffc8,&limit);
    uStack_38 = *puVar2;
  }
  return uStack_38;
}

Assistant:

size_t computeStackSize(const Instruction* program, size_t programSize) {
  const Instruction* i = program;
  const Instruction* e = program + programSize;
  size_t stackSize = 0;
  size_t limit = 0;

  while (i != e) {
    int change = getStackChange(*i);
    stackSize += change;
    limit = std::max(limit, stackSize);
    i++;
  }

  return limit;
}